

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

void Image_Function_Helper::Histogram
               (HistogramForm4 histogram,Image *image,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogramTable)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  (*histogram)(image,0,0,image->_width,image->_height,histogramTable);
  return;
}

Assistant:

void Histogram( FunctionTable::HistogramForm4 histogram,
                    const Image & image, std::vector < uint32_t > & histogramTable )
    {
        Image_Function::ParameterValidation( image );

        histogram( image, 0, 0, image.width(), image.height(), histogramTable );
    }